

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignVariablePairIdBadInput_Test::TestBody
          (Annotator_assignVariablePairIdBadInput_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_1a8 [8];
  Message local_1a0 [8];
  shared_ptr<libcellml::Variable> local_198;
  shared_ptr<libcellml::Variable> local_188;
  shared_ptr<libcellml::VariablePair> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130 [8];
  shared_ptr<libcellml::Variable> local_128;
  shared_ptr<libcellml::VariablePair> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0 [8];
  shared_ptr<libcellml::Variable> local_c8;
  shared_ptr<libcellml::Variable> local_b8;
  shared_ptr<libcellml::VariablePair> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  VariablePtr dummyVariable;
  AnnotatorPtr annotator;
  Annotator_assignVariablePairIdBadInput_Test *this_local;
  
  libcellml::Annotator::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"dummy",&local_51);
  libcellml::Variable::create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dummyVariable.
                            super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_b8,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_c8,(nullptr_t)0x0);
  libcellml::VariablePair::create((shared_ptr *)&local_a8,(shared_ptr *)&local_b8);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_98,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_78,"\"\"",
             "annotator->assignId(libcellml::VariablePair::create(nullptr, nullptr))",
             (char (*) [1])0x19fc0a,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_a8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x49c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dummyVariable.
                            super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_128,(nullptr_t)0x0);
  libcellml::VariablePair::create((shared_ptr *)&local_118,(shared_ptr *)local_30);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_108,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_e8,"\"\"",
             "annotator->assignId(libcellml::VariablePair::create(dummyVariable, nullptr))",
             (char (*) [1])0x19fc0a,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_118);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x49d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  peVar2 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&dummyVariable.
                            super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_188,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_198,(nullptr_t)0x0);
  libcellml::VariablePair::create((shared_ptr *)&local_178,(shared_ptr *)&local_188);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_168,(CellmlElementType)peVar2);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_148,"\"\"",
             "annotator->assignId(libcellml::VariablePair::create(nullptr, nullptr), libcellml::CellmlElementType::MODEL)"
             ,(char (*) [1])0x19fc0a,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr(&local_178);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_198);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x49e,pcVar3);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &dummyVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Annotator, assignVariablePairIdBadInput)
{
    auto annotator = libcellml::Annotator::create();
    auto dummyVariable = libcellml::Variable::create("dummy");

    EXPECT_EQ("", annotator->assignId(libcellml::VariablePair::create(nullptr, nullptr)));
    EXPECT_EQ("", annotator->assignId(libcellml::VariablePair::create(dummyVariable, nullptr)));
    EXPECT_EQ("", annotator->assignId(libcellml::VariablePair::create(nullptr, nullptr), libcellml::CellmlElementType::MODEL));
}